

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_tests.cpp
# Opt level: O0

void FooBarTest::PrintTo(STATE *state,iu_ostream *os)

{
  char *pcVar1;
  iu_ostream *os_local;
  STATE *state_local;
  
  pcVar1 = "NOT_RAN";
  if (*state != NOT_RAN) {
    pcVar1 = "RAN";
  }
  std::operator<<(os,pcVar1);
  return;
}

Assistant:

bool FilterTest(const char* filter
    , TestHoge::STATE ranTestHoge
    , HogeTest::STATE ranHogeTest
    , FooBar::STATE ranFooBar
    , FooBaz::STATE ranFooBaz
    , FooBarTest::STATE ranFooBarTest
    , FooQux::STATE ranFooQux
)
{
    TestHoge::state = TestHoge::NOT_RAN;
    HogeTest::state = HogeTest::NOT_RAN;
    FooBar::state = FooBar::NOT_RAN;
    FooBaz::state = FooBaz::NOT_RAN;
    FooBarTest::state = FooBarTest::NOT_RAN;
    FooQux::state = FooQux::NOT_RAN;

    ::iutest::IUTEST_FLAG(filter) = filter;
    const int ret = IUTEST_RUN_ALL_TESTS();
    if( ret != 0 ) return false;

    {
        IUTEST_SCOPED_TRACE(filter);

        IUTEST_EXPECT_EQ( ranTestHoge  , TestHoge::state );
        IUTEST_EXPECT_EQ( ranHogeTest  , HogeTest::state );
        IUTEST_EXPECT_EQ( ranFooBar    , FooBar::state );
        IUTEST_EXPECT_EQ( ranFooBaz    , FooBaz::state );
        IUTEST_EXPECT_EQ( ranFooBarTest, FooBarTest::state );
        IUTEST_EXPECT_EQ( ranFooQux    , FooQux::state );

        int nRan = 0;

        if( ranTestHoge ) ++nRan;
        if( ranHogeTest ) ++nRan;
        if( ranFooBar ) ++nRan;
        if( ranFooBaz ) ++nRan;
        if( ranFooBarTest ) ++nRan;
        if( ranFooQux ) ++nRan;

#if !defined(IUTEST_USE_GTEST) || (defined(GTEST_MINOR) && GTEST_MINOR >= 0x07)
        IUTEST_EXPECT_EQ( nRan, ::iutest::UnitTest::GetInstance()->reportable_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_disabled_test_count() );
#endif
#if !defined(IUTEST_USE_GTEST)
        const int kTotal = 6;
        IUTEST_EXPECT_EQ( kTotal-nRan, ::iutest::UnitTest::GetInstance()->skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_test_run_skipped_count() );
#endif
    }
    return ::iutest::UnitTest::GetInstance()->Passed();
}